

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_type_createAnonymousMetaclass(sysbvm_context_t *context,sysbvm_tuple_t supertype)

{
  sysbvm_object_tuple_t *psVar1;
  size_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_size_t value;
  
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).metaclassType,0x1e);
  psVar1[2].header.field_0.typePointer = supertype;
  psVar1[4].field_1.pointers[0] = 0x1b;
  if (supertype == 0) {
    value = 0x1d;
  }
  else {
    sVar2 = sysbvm_type_getTotalSlotCount(supertype);
    value = 0x1d;
    if (0x1d < sVar2) {
      value = sVar2;
    }
  }
  sVar3 = sysbvm_tuple_size_encode(context,value);
  psVar1[3].field_1.pointers[0] = sVar3;
  psVar1[4].header.field_0.typePointer = 0xb;
  psVar1[4].header.identityHashAndFlags = 0xb;
  psVar1[4].header.objectSize = 0;
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createAnonymousMetaclass(sysbvm_context_t *context, sysbvm_tuple_t supertype)
{
    sysbvm_metaclass_t* result = (sysbvm_metaclass_t*)sysbvm_context_allocatePointerTuple(context, context->roots.metaclassType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_metaclass_t));
    result->super.super.supertype = supertype;
    result->super.super.flags = sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_METATYPE_REQUIRED_FLAGS);

    size_t slotCount = SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_class_t);
    if(supertype)
    {
        size_t superTypeSlotCount = sysbvm_type_getTotalSlotCount(supertype);
        if(superTypeSlotCount > slotCount)
            slotCount = superTypeSlotCount;
    }
    
    result->super.super.totalSlotCount = sysbvm_tuple_size_encode(context, slotCount);
    result->super.super.instanceSize = sysbvm_tuple_size_encode(context, 0);
    result->super.super.instanceAlignment = sysbvm_tuple_size_encode(context, 0);
    return (sysbvm_tuple_t)result;
}